

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFetch(sqlite3_file *fd,i64 iOff,int nAmt,void **pp)

{
  int iVar1;
  int rc;
  unixFile *pFd;
  void **pp_local;
  int nAmt_local;
  i64 iOff_local;
  sqlite3_file *fd_local;
  
  *pp = (void *)0x0;
  if (0 < (long)fd[0xc].pMethods) {
    if ((fd[0xd].pMethods == (sqlite3_io_methods *)0x0) &&
       (iVar1 = unixMapfile((unixFile *)fd,-1), iVar1 != 0)) {
      return iVar1;
    }
    if (iOff + nAmt <= (long)fd[10].pMethods) {
      *pp = (void *)((long)&(fd[0xd].pMethods)->iVersion + iOff);
      *(int *)((long)&fd[9].pMethods + 4) = *(int *)((long)&fd[9].pMethods + 4) + 1;
    }
  }
  return 0;
}

Assistant:

static int unixFetch(sqlite3_file *fd, i64 iOff, int nAmt, void **pp){
#if SQLITE_MAX_MMAP_SIZE>0
  unixFile *pFd = (unixFile *)fd;   /* The underlying database file */
#endif
  *pp = 0;

#if SQLITE_MAX_MMAP_SIZE>0
  if( pFd->mmapSizeMax>0 ){
    if( pFd->pMapRegion==0 ){
      int rc = unixMapfile(pFd, -1);
      if( rc!=SQLITE_OK ) return rc;
    }
    if( pFd->mmapSize >= iOff+nAmt ){
      *pp = &((u8 *)pFd->pMapRegion)[iOff];
      pFd->nFetchOut++;
    }
  }
#endif
  return SQLITE_OK;
}